

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_exception.hxx
# Opt level: O2

void __thiscall nuraft::rpc_exception::~rpc_exception(rpc_exception *this)

{
  *(undefined ***)this = &PTR__rpc_exception_005c4d38;
  std::__cxx11::string::~string((string *)&this->err_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->req_).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

rpc_exception(const std::string& err, ptr<req_msg> req)
        : req_(req), err_(err.c_str()) {}